

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
dnet::data_types::tensor<int,_1U>::tensor(tensor<int,_1U> *this,array<unsigned_int,_1UL> size)

{
  value_type_conflict1 vVar1;
  iterator pvVar2;
  reference pvVar3;
  unsigned_long i;
  iterator iter;
  tensor<int,_1U> *this_local;
  array<unsigned_int,_1UL> size_local;
  
  this_local._4_4_ = size._M_elems[0];
  std::vector<int,_std::allocator<int>_>::vector(&this->_data);
  for (i = (unsigned_long)
           std::array<unsigned_int,_1UL>::begin((array<unsigned_int,_1UL> *)((long)&this_local + 4))
      ; (pvVar2 = std::array<unsigned_int,_1UL>::end
                            ((array<unsigned_int,_1UL> *)((long)&this_local + 4)),
        (iterator)i != pvVar2 &&
        (pvVar2 = std::array<unsigned_int,_1UL>::begin
                            ((array<unsigned_int,_1UL> *)((long)&this_local + 4)),
        (long)(i - (long)pvVar2) >> 2 == 0)); i = i + 4) {
    vVar1 = *(value_type_conflict1 *)i;
    pvVar3 = std::array<unsigned_int,_1UL>::operator[](&this->_shape,0);
    *pvVar3 = vVar1;
  }
  init(this,(EVP_PKEY_CTX *)&this->_shape);
  return;
}

Assistant:

tensor<T, N>::tensor(std::array<index_type, N> size)
        {
            for (auto iter = size.begin(); iter != size.end(); iter++) {
                unsigned long i = iter - size.begin();
                if (i >= N) {
                    break;
                }
                this->_shape[i] = *iter;
            }
            this->init(this->_shape);
        }